

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ReadListFileAsString(cmMakefile *this,string *content,string *virtualFileName)

{
  bool bVar1;
  string *in_base;
  char *str;
  char *virtual_filename;
  cmMessenger *messenger;
  undefined1 local_80 [8];
  cmListFile listFile;
  undefined1 local_58 [8];
  ListFileScope scope;
  string filenametoread;
  string *virtualFileName_local;
  string *content_local;
  cmMakefile *this_local;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&scope.ReportError,virtualFileName,in_base);
  ListFileScope::ListFileScope((ListFileScope *)local_58,this,(string *)&scope.ReportError);
  cmListFile::cmListFile((cmListFile *)local_80);
  str = (char *)std::__cxx11::string::c_str();
  virtual_filename = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseString
                    ((cmListFile *)local_80,str,virtual_filename,messenger,&this->Backtrace);
  if (bVar1) {
    RunListFile(this,(cmListFile *)local_80,(string *)&scope.ReportError,(DeferCommands *)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      ListFileScope::Quiet((ListFileScope *)local_58);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmListFile::~cmListFile((cmListFile *)local_80);
  ListFileScope::~ListFileScope((ListFileScope *)local_58);
  std::__cxx11::string::~string((string *)&scope.ReportError);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadListFileAsString(const std::string& content,
                                      const std::string& virtualFileName)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    virtualFileName, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseString(content.c_str(), virtualFileName.c_str(),
                            this->GetMessenger(), this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}